

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O2

bool VerifyCharacterVector
               (Verifier *verifier,Vector<flatbuffers::Offset<void>,_unsigned_int> *values,
               Vector<unsigned_char,_unsigned_int> *types)

{
  Character type;
  bool bVar1;
  return_type obj;
  uoffset_t i;
  uint i_00;
  bool bVar2;
  
  if (values == (Vector<flatbuffers::Offset<void>,_unsigned_int> *)0x0 ||
      types == (Vector<unsigned_char,_unsigned_int> *)0x0) {
    bVar2 = values == (Vector<flatbuffers::Offset<void>,_unsigned_int> *)0x0 &&
            types == (Vector<unsigned_char,_unsigned_int> *)0x0;
  }
  else {
    i_00 = 0;
    bVar2 = false;
    if (*(int *)values == *(int *)types) {
      do {
        bVar2 = *(uint *)values <= i_00;
        if (bVar2) {
          return bVar2;
        }
        obj = flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>::Get(values,i_00);
        type = flatbuffers::Vector<unsigned_char,_unsigned_int>::Get(types,i_00);
        bVar1 = VerifyCharacter(verifier,obj,type);
        i_00 = i_00 + 1;
      } while (bVar1);
    }
  }
  return bVar2;
}

Assistant:

inline bool VerifyCharacterVector(::flatbuffers::Verifier &verifier, const ::flatbuffers::Vector<::flatbuffers::Offset<void>> *values, const ::flatbuffers::Vector<uint8_t> *types) {
  if (!values || !types) return !values && !types;
  if (values->size() != types->size()) return false;
  for (::flatbuffers::uoffset_t i = 0; i < values->size(); ++i) {
    if (!VerifyCharacter(
        verifier,  values->Get(i), types->GetEnum<Character>(i))) {
      return false;
    }
  }
  return true;
}